

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

string * __thiscall
tcu::FloatFormat::intervalToHex_abi_cxx11_
          (string *__return_storage_ptr__,FloatFormat *this,Interval *interval)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  dVar2 = interval->m_lo;
  pdVar1 = &interval->m_hi;
  if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      local_f8._M_dataplus._M_p._0_1_ = 1;
      local_f8._M_string_length = 0xfff0000000000000;
      local_f8.field_2._M_allocated_capacity = 0x7ff0000000000000;
      bVar3 = Interval::operator==(interval,(Interval *)&local_f8);
      if (bVar3) {
        pcVar4 = "<any>";
        goto LAB_015f64aa;
      }
      pcVar4 = glcts::fixed_sample_locations_values + 1;
      if (interval->m_hasNaN != false) {
        pcVar4 = "{ NaN } | ";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar4,&local_f9);
      std::operator+(&local_98,&local_38,"[");
      floatToHex_abi_cxx11_(&local_58,this,interval->m_lo);
      std::operator+(&local_d8,&local_98,&local_58);
      std::operator+(&local_b8,&local_d8,", ");
      floatToHex_abi_cxx11_(&local_78,this,interval->m_hi);
      std::operator+(&local_f8,&local_b8,&local_78);
      std::operator+(__return_storage_ptr__,&local_f8,"]");
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_98);
      this_00 = &local_38;
    }
    else {
      pcVar4 = "{ ";
      if (interval->m_hasNaN != false) {
        pcVar4 = "{ NaN, ";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,pcVar4,(allocator<char> *)&local_98);
      floatToHex_abi_cxx11_(&local_d8,this,interval->m_lo);
      std::operator+(&local_f8,&local_b8,&local_d8);
      std::operator+(__return_storage_ptr__,&local_f8," }");
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      this_00 = &local_b8;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    pcVar4 = "{}";
    if (interval->m_hasNaN != false) {
      pcVar4 = "{ NaN }";
    }
LAB_015f64aa:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatFormat::intervalToHex (const Interval& interval) const
{
	if (interval.empty())
		return interval.hasNaN() ? "{ NaN }" : "{}";

	else if (interval.lo() == interval.hi())
		return (std::string(interval.hasNaN() ? "{ NaN, " : "{ ") +
				floatToHex(interval.lo()) + " }");
	else if (interval == Interval::unbounded(true))
		return "<any>";

	return (std::string(interval.hasNaN() ? "{ NaN } | " : "") +
			"[" + floatToHex(interval.lo()) + ", " + floatToHex(interval.hi()) + "]");
}